

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.h
# Opt level: O3

bool __thiscall
bidirectional::BiDirectional::checkVertexVisited
          (BiDirectional *this,Directions *direction,int *vertex_idx)

{
  int iVar1;
  _Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_> _Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  _Var2.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl =
       (&this->fwd_search_ptr_)[*direction != FWD]._M_t.
       super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>.
       _M_t.
       super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>.
       super__Head_base<0UL,_bidirectional::Search_*,_false>;
  lVar4 = *(long *)((long)_Var2.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl +
                   0x30);
  lVar3 = (long)_Var2.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl + 0x28;
  lVar6 = lVar3;
  if (lVar4 != 0) {
    iVar1 = *vertex_idx;
    lVar5 = lVar3;
    do {
      if (iVar1 <= *(int *)(lVar4 + 0x20)) {
        lVar5 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(int *)(lVar4 + 0x20) < iVar1) * 8);
    } while (lVar4 != 0);
    if ((lVar5 != lVar3) && (lVar6 = lVar5, iVar1 < *(int *)(lVar5 + 0x20))) {
      lVar6 = lVar3;
    }
  }
  return lVar6 != lVar3;
}

Assistant:

Search* getSearchPtr(Directions direction) {
    if (direction == FWD)
      return fwd_search_ptr_.get();
    return bwd_search_ptr_.get();
  }